

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

Polygon * ClipperLib::BuildArc
                    (Polygon *__return_storage_ptr__,IntPoint *pt,double a1,double a2,double r)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  double dVar5;
  allocator_type local_51;
  double local_50;
  double local_48;
  double local_38;
  
  local_48 = a2 - a1;
  uVar3 = 6;
  if (6 < (int)(ABS(local_48) * SQRT(ABS(r)))) {
    uVar3 = (int)(ABS(local_48) * SQRT(ABS(r)));
  }
  if (0xfffff < (int)uVar3) {
    uVar3 = 0x100000;
  }
  local_50 = a1;
  local_38 = r;
  std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>::vector
            (__return_storage_ptr__,(ulong)uVar3,&local_51);
  local_48 = local_48 / (double)(int)(uVar3 - 1);
  for (uVar2 = 0; uVar3 << 4 != uVar2; uVar2 = uVar2 + 0x10) {
    lVar1 = pt->X;
    dVar5 = cos(local_50);
    uVar4 = -(ulong)(dVar5 * local_38 < 0.0);
    *(long *)((long)&((__return_storage_ptr__->
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      )._M_impl.super__Vector_impl_data._M_start)->X + uVar2) =
         (long)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) +
               dVar5 * local_38) + lVar1;
    lVar1 = pt->Y;
    dVar5 = ::sin(local_50);
    uVar4 = -(ulong)(dVar5 * local_38 < 0.0);
    *(long *)((long)&((__return_storage_ptr__->
                      super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
                      )._M_impl.super__Vector_impl_data._M_start)->Y + uVar2) =
         (long)((double)(~uVar4 & 0x3fe0000000000000 | uVar4 & 0xbfe0000000000000) +
               dVar5 * local_38) + lVar1;
    local_50 = local_50 + local_48;
  }
  return __return_storage_ptr__;
}

Assistant:

Polygon BuildArc(const IntPoint &pt,
  const double a1, const double a2, const double r)
{
  long64 steps = std::max(6, int(std::sqrt(std::fabs(r)) * std::fabs(a2 - a1)));
  if (steps > 0x100000) steps = 0x100000;
  int n = (unsigned)steps;
  Polygon result(n);
  double da = (a2 - a1) / (n -1);
  double a = a1;
  for (int i = 0; i < n; ++i)
  {
    result[i].X = pt.X + Round(std::cos(a)*r);
    result[i].Y = pt.Y + Round(std::sin(a)*r);
    a += da;
  }
  return result;
}